

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

bool __thiscall
HighsCliqueTable::foundCover
          (HighsCliqueTable *this,HighsDomain *globaldom,CliqueVar v1,CliqueVar v2)

{
  double dVar1;
  double dVar2;
  CliqueVar CVar3;
  pointer pCVar4;
  HighsInt HVar5;
  HighsInt cliqueid;
  byte bVar6;
  uint col;
  long lVar7;
  long lVar8;
  bool bVar9;
  double val;
  byte local_53;
  
  HVar5 = findCommonCliqueId(this,v1,v2);
  cliqueid = HVar5;
  while (cliqueid != -1) {
    pCVar4 = (this->cliques).
             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)pCVar4[cliqueid].start;
    lVar8 = pCVar4[cliqueid].end - lVar7;
    lVar7 = lVar7 << 2;
    while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
      CVar3 = *(CliqueVar *)
               (&((this->cliqueentries).
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar7);
      if (CVar3 != v2 && CVar3 != v1) {
        col = (uint)CVar3 & 0x7fffffff;
        dVar1 = (globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[col];
        dVar2 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[col];
        val = 1.0;
        if ((int)CVar3 < 0) {
          val = 0.0;
        }
        HighsDomain::fixCol(globaldom,col,val,(Reason)0xfffffffe);
        bVar9 = globaldom->infeasible_;
        bVar6 = HVar5 != -1;
        if (bVar9 == false) {
          bVar6 = local_53;
        }
        if (dVar1 != dVar2 && bVar9 == false) {
          this->nfixings = this->nfixings + 1;
          std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
          emplace_back<HighsCliqueTable::CliqueVar&>
                    ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                      *)&this->infeasvertexstack,
                     (CliqueVar *)
                     (&((this->cliqueentries).
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar7));
          bVar6 = local_53;
        }
        local_53 = bVar6;
        if (bVar9 != false) goto LAB_00277927;
      }
      lVar7 = lVar7 + 4;
    }
    removeClique(this,cliqueid);
    cliqueid = findCommonCliqueId(this,v1,v2);
  }
  processInfeasibleVertices(this,globaldom);
  local_53 = HVar5 != -1;
LAB_00277927:
  return (bool)(local_53 & 1);
}

Assistant:

bool HighsCliqueTable::foundCover(HighsDomain& globaldom, CliqueVar v1,
                                  CliqueVar v2) {
  bool equality = false;
  HighsInt commonclique = findCommonCliqueId(v1, v2);
  if (commonclique != -1) equality = true;

  while (commonclique != -1) {
    HighsInt start = cliques[commonclique].start;
    HighsInt end = cliques[commonclique].end;

    for (HighsInt i = start; i != end; ++i) {
      if (cliqueentries[i] == v1 || cliqueentries[i] == v2) continue;

      bool wasfixed = globaldom.isFixed(cliqueentries[i].col);
      globaldom.fixCol(cliqueentries[i].col, 1 - cliqueentries[i].val);
      if (globaldom.infeasible()) return equality;
      if (!wasfixed) {
        ++nfixings;
        infeasvertexstack.emplace_back(cliqueentries[i]);
      }
    }

    removeClique(commonclique);
    commonclique = findCommonCliqueId(v1, v2);
  }

  processInfeasibleVertices(globaldom);

  return equality;
}